

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrprecond.h
# Opt level: O3

int __thiscall
TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_>::ClassId
          (TPZDohrPrecond<std::complex<double>,_TPZDohrSubstruct<std::complex<double>_>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string local_c08;
  TPZDohrSubstruct<std::complex<double>_> local_be8;
  
  local_c08._M_dataplus._M_p = (pointer)&local_c08.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c08,"TPZDohrPrecond","");
  uVar1 = Hash(&local_c08);
  iVar2 = TPZMatrix<std::complex<double>_>::ClassId(&this->super_TPZMatrix<std::complex<double>_>);
  TPZDohrSubstruct<std::complex<double>_>::TPZDohrSubstruct(&local_be8);
  iVar3 = TPZDohrSubstruct<std::complex<double>_>::ClassId(&local_be8);
  TPZDohrSubstruct<std::complex<double>_>::~TPZDohrSubstruct(&local_be8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c08._M_dataplus._M_p != &local_c08.field_2) {
    operator_delete(local_c08._M_dataplus._M_p,local_c08.field_2._M_allocated_capacity + 1);
  }
  return iVar3 << 2 ^ iVar2 * 2 ^ uVar1;
}

Assistant:

int TPZDohrPrecond<TVar, TSubStruct>::ClassId() const{
    return Hash("TPZDohrPrecond") ^ TPZMatrix<TVar>::ClassId() << 1 ^ TSubStruct().ClassId() << 2;
}